

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O3

void __thiscall
TextProviderString::TextProviderString
          (TextProviderString *this,shared_ptr<PSLogger> *p_logger,string *p_text)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  bool bVar3;
  bool *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  peVar1 = (p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_TextProvider)._vptr_TextProvider = (_func_int **)&PTR__TextProvider_00164d30;
    (this->super_TextProvider).m_logger.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->super_TextProvider).m_logger.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_TextProvider).m_has_error = false;
    (this->super_TextProvider).m_current_char_idx = -1;
    (this->super_TextProvider).m_current_char = '\0';
    goto LAB_001498ec;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar3 = __libc_single_threaded != '\0';
    (this->super_TextProvider)._vptr_TextProvider = (_func_int **)&PTR__TextProvider_00164d30;
    (this->super_TextProvider).m_logger.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->super_TextProvider).m_logger.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (bVar3) goto LAB_001498c5;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (this->super_TextProvider)._vptr_TextProvider = (_func_int **)&PTR__TextProvider_00164d30;
    (this->super_TextProvider).m_logger.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->super_TextProvider).m_logger.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
LAB_001498c5:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  (this->super_TextProvider).m_has_error = false;
  (this->super_TextProvider).m_current_char_idx = -1;
  (this->super_TextProvider).m_current_char = '\0';
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_001498ec:
  local_78 = &(this->super_TextProvider).m_has_error;
  (this->super_TextProvider)._vptr_TextProvider = (_func_int **)&PTR__TextProviderString_00164c60;
  (this->m_text)._M_dataplus._M_p = (pointer)&(this->m_text).field_2;
  pcVar2 = (p_text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_text,pcVar2,pcVar2 + p_text->_M_string_length);
  (this->m_iterator).
  super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_engaged = false;
  if ((this->m_text)._M_string_length == 0) {
    peVar1 = (this->super_TextProvider).m_logger.
             super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_dataplus._M_p,
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_dataplus._M_p +
               TextProvider::m_parser_text_provider_log_cat_abi_cxx11_._M_string_length);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"text provided is empty. Parsing will fail.","");
    (*peVar1->_vptr_PSLogger[2])(peVar1,4,local_50,local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    *local_78 = true;
  }
  else {
    (this->super_TextProvider).m_current_char_idx = 0;
  }
  return;
}

Assistant:

TextProviderString::TextProviderString(shared_ptr<PSLogger> p_logger, string p_text)
:TextProvider(p_logger), m_text(p_text)
{
	//todo add some kind of check in case the logger isn't valid

	if(m_text.empty())
	{
		m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat, "text provided is empty. Parsing will fail.");
		m_has_error = true;
	}
	else
	{
		m_current_char_idx = 0;
	}
}